

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkt-proc-builder.cpp
# Opt level: O0

void __thiscall yactfr::internal::InstrFinder::visit(InstrFinder *this,BeginReadSlArrayInstr *instr)

{
  bool bVar1;
  StaticLengthArrayType *this_00;
  BeginReadSlArrayInstr *instr_local;
  InstrFinder *this_local;
  
  if ((this->_findWithMetadataStreamUuidRole & 1U) != 0) {
    this_00 = BeginReadSlArrayInstr::slArrayType(instr);
    bVar1 = StaticLengthArrayType::hasMetadataStreamUuidRole(this_00);
    if (bVar1) {
      std::function<void_(yactfr::internal::InstrLoc_&)>::operator()
                (&this->_func,&(this->super_CallerInstrVisitor)._curInstrLoc);
    }
  }
  _visit(this,&instr->super_BeginReadCompoundInstr);
  return;
}

Assistant:

void visit(BeginReadSlArrayInstr& instr) override
    {
        if (_findWithMetadataStreamUuidRole && instr.slArrayType().hasMetadataStreamUuidRole()) {
            _func(_curInstrLoc);
        }

        this->_visit(instr);
    }